

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::Array<const_int>::~Array(Array<const_int> *this)

{
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }